

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int rd_contents_init(archive_read *a,enctype encoding,int a_sum_alg,int e_sum_alg)

{
  int r;
  int e_sum_alg_local;
  int a_sum_alg_local;
  enctype encoding_local;
  archive_read *a_local;
  
  a_local._4_4_ = decompression_init(a,encoding);
  if (a_local._4_4_ == 0) {
    checksum_init(a,a_sum_alg,e_sum_alg);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
rd_contents_init(struct archive_read *a, enum enctype encoding,
    int a_sum_alg, int e_sum_alg)
{
	int r;

	/* Init decompress library. */
	if ((r = decompression_init(a, encoding)) != ARCHIVE_OK)
		return (r);
	/* Init checksum library. */
	checksum_init(a, a_sum_alg, e_sum_alg);
	return (ARCHIVE_OK);
}